

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# history_buffer.c
# Opt level: O3

void history_buffer_destroy(history_buffer *buf)

{
  ulong uVar1;
  
  if (buf->cap != 0) {
    uVar1 = 0;
    do {
      free(buf->history[uVar1]);
      uVar1 = uVar1 + 1;
    } while (uVar1 < buf->cap);
  }
  free(buf->history);
  free(buf->fetched);
  free(buf);
  return;
}

Assistant:

void history_buffer_destroy(history_buffer *buf) {
    for (unsigned int i = 0; i < buf->cap; i++) {
        free(buf->history[i]);
    }
    free(buf->history);
    free(buf->fetched);
    free(buf);
}